

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O3

void __thiscall
Test::HTMLOutput::generateTestsTable
          (HTMLOutput *this,ostream *stream,SuiteInfo *suite,bool includePassed)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer pAVar3;
  char cVar4;
  ostream *poVar5;
  ulong uVar6;
  undefined1 *puVar7;
  long lVar8;
  ulong uVar9;
  pointer pAVar10;
  pointer methodName;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 local_88;
  undefined2 local_80;
  undefined1 local_7e [6];
  string local_78;
  SuiteInfo *local_58;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<table id=\'suite_",0x11);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(suite->suiteName)._M_dataplus._M_p,(suite->suiteName)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'>",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "<tr><th>Test-method</th><th># Assertions</th><th>Passed Assertions</th><th>Failures</th></tr>"
             ,0x5d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  methodName = (suite->methods).
               super__Vector_base<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
  cVar4 = (char)stream;
  local_58 = suite;
  if (methodName !=
      (suite->methods).
      super__Vector_base<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pAVar10 = (methodName->failedAssertions).
                super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pAVar1 = (methodName->passedAssertions).
               super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pAVar2 = (methodName->passedAssertions).
               super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar3 = (methodName->failedAssertions).
               super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>(stream,"<tr><td>",8);
      Output::stripMethodName(&local_78,(Output *)this,&methodName->methodName);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,local_78._M_dataplus._M_p,local_78._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
      Output::truncateString(&local_50,(Output *)this,&methodName->argString,0x14);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")</td>",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<td>",4);
      uVar9 = ((long)pAVar10 - (long)pAVar3 >> 3) * -0x70a3d70a3d70a3d7 +
              ((long)pAVar1 - (long)pAVar2 >> 3) * -0x70a3d70a3d70a3d7;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</td>",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<td class=\'",0xb);
      uVar6 = ((long)(methodName->passedAssertions).
                     super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(methodName->passedAssertions).
                     super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x70a3d70a3d70a3d7;
      if (uVar9 == uVar6) {
        local_88 = 0x65737361506c6c61;
LAB_0011ce08:
        local_80 = CONCAT11(local_80._1_1_,100);
        lVar8 = 9;
        puVar7 = (undefined1 *)((long)&local_80 + 1);
      }
      else {
        if (uVar6 < uVar9 * 3 >> 2) {
          if (uVar6 < (uVar9 >> 1 & 0x3fffffffffffffff)) {
            if (uVar6 < uVar9 >> 2) {
              local_88 = 0x6573736150776566;
              goto LAB_0011ce08;
            }
            local_88 = 0x73736150656d6f73;
          }
          else {
            local_88 = 0x73736150796e616d;
          }
        }
        else {
          local_88 = 0x7373615074736f6d;
        }
        local_80 = 0x6465;
        lVar8 = 10;
        puVar7 = local_7e;
      }
      *puVar7 = 0;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_88,lVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'>",2);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
      lVar8 = ((long)(methodName->passedAssertions).
                     super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(methodName->passedAssertions).
                     super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x70a3d70a3d70a3d7;
      auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar12._0_8_ = lVar8;
      auVar12._12_4_ = 0x45300000;
      auVar13._8_4_ = (int)(uVar9 >> 0x20);
      auVar13._0_8_ = uVar9;
      auVar13._12_4_ = 0x45300000;
      dVar11 = Output::prettifyPercentage
                         ((Output *)this,
                          (auVar12._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0),
                          (auVar13._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
      poVar5 = std::ostream::_M_insert<double>(dVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"%)</td>",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<td>",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      for (pAVar10 = (methodName->failedAssertions).
                     super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pAVar10 !=
          (methodName->failedAssertions).
          super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
          super__Vector_impl_data._M_finish; pAVar10 = pAVar10 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (stream,"<span class=\'message\'><a href=\'file://",0x26);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(pAVar10->file)._M_dataplus._M_p,(pAVar10->file)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'>",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(pAVar10->file)._M_dataplus._M_p,(pAVar10->file)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</a>: ",6);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        Output::truncateString
                  (&local_78,(Output *)this,
                   &pAVar10->errorMessage + ((pAVar10->errorMessage)._M_string_length == 0),0x3e);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_78._M_dataplus._M_p,local_78._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</span>",7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,"</td>",5);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"</tr>",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      methodName = methodName + 1;
    } while (methodName !=
             (local_58->methods).
             super__Vector_base<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"</table>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<a href=\'#top\'>Back to top</a>",0x1e)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  return;
}

Assistant:

void HTMLOutput::generateTestsTable(std::ostream &stream, const SuiteInfo &suite, bool includePassed) {
  stream << "<table id='suite_" << suite.suiteName << "'>"
         << "<tr><th>Test-method</th><th># Assertions</th><th>Passed Assertions</th><th>Failures</th></tr>"
         << std::endl;
  // content
  auto testMethod = suite.methods.begin();
  while (testMethod != suite.methods.end()) {
    std::size_t totalAssertions = testMethod->passedAssertions.size() + testMethod->failedAssertions.size();
    stream << "<tr><td>" << stripMethodName(testMethod->methodName) << "(" << truncateString(testMethod->argString, 20)
           << ")</td>"
           << "<td>" << totalAssertions << "</td>"
           << "<td class='" << getCssClass(totalAssertions, testMethod->passedAssertions.size()) << "'>"
           << testMethod->passedAssertions.size() << " ("
           << prettifyPercentage(
                  static_cast<double>(testMethod->passedAssertions.size()), static_cast<double>(totalAssertions))
           << "%)</td>"
           << "<td>";
    auto assertion = testMethod->failedAssertions.begin();
    while (assertion != testMethod->failedAssertions.end()) {
      stream << "<span class='message'><a href='file://" << assertion->file << "'>" << assertion->file
             << "</a>: " << assertion->lineNumber << ": "
             << truncateString(
                    (!assertion->errorMessage.empty() ? assertion->errorMessage : assertion->userMessage), 62)
             << "</span>";
      ++assertion;
    }
    stream << "</td>"
           << "</tr>" << std::endl;
    ++testMethod;
  }
  stream << "</table>" << std::endl;
  stream << "<a href='#top'>Back to top</a>" << std::endl;
}